

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O0

int arkStep_SetMaxNonlinIters(ARKodeMem ark_mem,int maxcor)

{
  int iVar1;
  int in_ESI;
  ARKodeMem in_RDI;
  SUNContext_conflict sunctx_local_scope_;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeARKStepMem *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  long local_20;
  int local_4;
  
  local_4 = arkStep_AccessStepMem
                      ((ARKodeMem)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (local_4 == 0) {
    if (*(long *)(local_20 + 0x88) == 0) {
      arkProcessError(in_RDI,-0x20,0x414,"arkStep_SetMaxNonlinIters",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                      ,"No SUNNonlinearSolver object is present");
      local_4 = -0x16;
    }
    else {
      if (in_ESI < 1) {
        *(undefined4 *)(local_20 + 0x108) = 3;
      }
      else {
        *(int *)(local_20 + 0x108) = in_ESI;
      }
      iVar1 = SUNNonlinSolSetMaxIters
                        (*(undefined8 *)(local_20 + 0x88),*(undefined4 *)(local_20 + 0x108));
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        arkProcessError(in_RDI,-0x20,0x421,"arkStep_SetMaxNonlinIters",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                        ,"Error setting maxcor in SUNNonlinearSolver object");
        local_4 = -0x20;
      }
    }
  }
  return local_4;
}

Assistant:

int arkStep_SetMaxNonlinIters(ARKodeMem ark_mem, int maxcor)
{
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  SUNFunctionBegin(ark_mem->sunctx);

  /* Return error message if no NLS module is present */
  if (step_mem->NLS == NULL)
  {
    arkProcessError(ark_mem, ARK_NLS_OP_ERR, __LINE__, __func__, __FILE__,
                    "No SUNNonlinearSolver object is present");
    return (ARK_ILL_INPUT);
  }

  /* argument <= 0 sets default, otherwise set input */
  if (maxcor <= 0) { step_mem->maxcor = MAXCOR; }
  else { step_mem->maxcor = maxcor; }

  /* send argument to NLS structure */
  retval = SUNNonlinSolSetMaxIters(step_mem->NLS, step_mem->maxcor);
  if (retval != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_NLS_OP_ERR, __LINE__, __func__, __FILE__,
                    "Error setting maxcor in SUNNonlinearSolver object");
    return (ARK_NLS_OP_ERR);
  }

  return (ARK_SUCCESS);
}